

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

typed_address<pstore::index::header_block> __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::write_header_block
          (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,transaction_base *transaction)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  index_pointer local_50;
  value_type local_48;
  undefined1 local_40 [8];
  pair<std::shared_ptr<pstore::index::header_block>,_pstore::typed_address<pstore::index::header_block>_>
  pos;
  transaction_base *transaction_local;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  pos.second.a_.a_ = (address)root(this);
  bVar1 = details::index_pointer::is_address((index_pointer *)&pos.second);
  if (!bVar1) {
    assert_failed("this->root ().is_address ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x42b);
  }
  transaction_base::alloc_rw<pstore::index::header_block,void>
            ((pair<std::shared_ptr<pstore::index::header_block>,_pstore::typed_address<pstore::index::header_block>_>
              *)local_40,transaction,1);
  peVar2 = std::
           __shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  *(undefined8 *)(peVar2->signature)._M_elems = 0x7264654878646e49;
  sVar3 = size(this);
  peVar2 = std::
           __shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  peVar2->size = sVar3;
  local_50 = root(this);
  local_48 = (value_type)details::index_pointer::to_address((index_pointer *)&local_50.addr_);
  peVar2 = std::
           __shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  (peVar2->root).a_ = local_48;
  std::
  pair<std::shared_ptr<pstore::index::header_block>,_pstore::typed_address<pstore::index::header_block>_>
  ::~pair((pair<std::shared_ptr<pstore::index::header_block>,_pstore::typed_address<pstore::index::header_block>_>
           *)local_40);
  return (typed_address<pstore::index::header_block>)
         (address)pos.first.
                  super___shared_ptr<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
}

Assistant:

typed_address<header_block>
        hamt_map<KeyType, ValueType, Hash, KeyEqual>::write_header_block (
            transaction_base & transaction) {
            PSTORE_ASSERT (this->root ().is_address ());
            auto const pos = transaction.alloc_rw<header_block> ();
            pos.first->signature = index_signature;
            pos.first->size = this->size ();
            pos.first->root = this->root ().to_address ();
            return pos.second;
        }